

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

bool __thiscall
Chainstate::ResizeCoinsCaches(Chainstate *this,size_t coinstip_size,size_t coinsdb_size)

{
  long lVar1;
  ulong uVar2;
  bool bVar3;
  CCoinsViewDB *this_00;
  long in_FS_OFFSET;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  BlockValidationState state;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = this->m_coinstip_cache_size_bytes;
  if ((uVar2 != coinstip_size) || (bVar3 = true, this->m_coinsdb_cache_size_bytes != coinsdb_size))
  {
    this->m_coinstip_cache_size_bytes = coinstip_size;
    this->m_coinsdb_cache_size_bytes = coinsdb_size;
    this_00 = CoinsDB(this);
    CCoinsViewDB::ResizeCache(this_00,coinsdb_size);
    ToString_abi_cxx11_((string *)&state,this);
    auVar4._8_4_ = (int)(coinsdb_size >> 0x20);
    auVar4._0_8_ = coinsdb_size;
    auVar4._12_4_ = 0x45300000;
    logging_function._M_str = "ResizeCoinsCaches";
    logging_function._M_len = 0x11;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp";
    source_file._M_len = 0x57;
    LogPrintf_<std::__cxx11::string,double>
              (logging_function,source_file,0x15aa,
               I2P|VALIDATION|QT|COINDB|MEMPOOLREJ|PROXY|RAND|ADDRMAN|RPC|ZMQ|BENCH|TOR,
               (Level)(string *)&state,&stack0xffffffffffffff78,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (((auVar4._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)coinsdb_size) - 4503599627370496.0)) *
               9.5367431640625e-07),
               (double *)state.super_ValidationState<BlockValidationResult>._0_8_);
    std::__cxx11::string::~string((string *)&state);
    ToString_abi_cxx11_((string *)&state,this);
    auVar5._8_4_ = (int)(coinstip_size >> 0x20);
    auVar5._0_8_ = coinstip_size;
    auVar5._12_4_ = 0x45300000;
    logging_function_00._M_str = "ResizeCoinsCaches";
    logging_function_00._M_len = 0x11;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp";
    source_file_00._M_len = 0x57;
    LogPrintf_<std::__cxx11::string,double>
              (logging_function_00,source_file_00,0x15ac,
               I2P|VALIDATION|QT|COINDB|MEMPOOLREJ|PROXY|RAND|ADDRMAN|RPC|WALLETDB|BENCH|HTTP|TOR,
               (Level)(string *)&state,&stack0xffffffffffffff78,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (((auVar5._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)coinstip_size) - 4503599627370496.0)) *
               9.5367431640625e-07),
               (double *)state.super_ValidationState<BlockValidationResult>._0_8_);
    std::__cxx11::string::~string((string *)&state);
    state.super_ValidationState<BlockValidationResult>.m_mode = M_VALID;
    state.super_ValidationState<BlockValidationResult>.m_result = BLOCK_RESULT_UNSET;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
         (pointer)&state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_local_buf[0] =
         '\0';
    state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p =
         (pointer)&state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2;
    state.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length = 0;
    state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_local_buf[0] =
         '\0';
    bVar3 = FlushStateToDisk(this,&state,(uint)(coinstip_size <= uVar2) * 2 + IF_NEEDED,0);
    ValidationState<BlockValidationResult>::~ValidationState
              (&state.super_ValidationState<BlockValidationResult>);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool Chainstate::ResizeCoinsCaches(size_t coinstip_size, size_t coinsdb_size)
{
    AssertLockHeld(::cs_main);
    if (coinstip_size == m_coinstip_cache_size_bytes &&
            coinsdb_size == m_coinsdb_cache_size_bytes) {
        // Cache sizes are unchanged, no need to continue.
        return true;
    }
    size_t old_coinstip_size = m_coinstip_cache_size_bytes;
    m_coinstip_cache_size_bytes = coinstip_size;
    m_coinsdb_cache_size_bytes = coinsdb_size;
    CoinsDB().ResizeCache(coinsdb_size);

    LogPrintf("[%s] resized coinsdb cache to %.1f MiB\n",
        this->ToString(), coinsdb_size * (1.0 / 1024 / 1024));
    LogPrintf("[%s] resized coinstip cache to %.1f MiB\n",
        this->ToString(), coinstip_size * (1.0 / 1024 / 1024));

    BlockValidationState state;
    bool ret;

    if (coinstip_size > old_coinstip_size) {
        // Likely no need to flush if cache sizes have grown.
        ret = FlushStateToDisk(state, FlushStateMode::IF_NEEDED);
    } else {
        // Otherwise, flush state to disk and deallocate the in-memory coins map.
        ret = FlushStateToDisk(state, FlushStateMode::ALWAYS);
    }
    return ret;
}